

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O1

Aig_Man_t * Fra_ClassesDeriveAig(Fra_Cla_t *p,int nFramesK)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  void *pvVar4;
  long lVar5;
  Aig_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  void *__ptr;
  Aig_Obj_t *pAVar8;
  ulong *__ptr_00;
  Vec_Ptr_t *pVVar9;
  Aig_Man_t *pAVar10;
  uint uVar11;
  int iVar12;
  Aig_Obj_t *pAVar13;
  ulong *puVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  bool bVar18;
  
  pAVar10 = p->pAig;
  if (pAVar10->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x322,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  if (pAVar10->nObjs[2] <= pAVar10->nRegs) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x323,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  if (nFramesK < 1) {
    __assert_fail("nFramesK > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                  ,0x324,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
  }
  p_00 = Aig_ManStart(pAVar10->vObjs->nSize * (nFramesK + 1));
  pAVar10 = p->pAig;
  pcVar3 = pAVar10->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pName = pcVar7;
  pcVar3 = pAVar10->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pSpec = pcVar7;
  __ptr = malloc((long)pAVar10->vObjs->nSize << 3);
  *(Aig_Obj_t **)((long)__ptr + (long)pAVar10->pConst1->Id * 8) = p_00->pConst1;
  uVar11 = pAVar10->nObjs[2] - pAVar10->nRegs;
  pAVar10 = p->pAig;
  pVVar9 = pAVar10->vCis;
  if ((int)uVar11 < pVVar9->nSize) {
    uVar15 = (ulong)uVar11;
    do {
      if ((int)uVar11 < 0) {
LAB_005c45ec:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar4 = pVVar9->pArray[uVar15];
      pAVar8 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar4 + 0x24) * 8) = pAVar8;
      uVar15 = uVar15 + 1;
      pAVar10 = p->pAig;
      pVVar9 = pAVar10->vCis;
    } while ((int)uVar15 < pVVar9->nSize);
  }
  __ptr_00 = (ulong *)malloc((long)pAVar10->nRegs << 3);
  iVar12 = 0;
  do {
    pAVar10 = p->pAig;
    uVar11 = pAVar10->nObjs[2] - pAVar10->nRegs;
    uVar15 = (ulong)uVar11;
    if (uVar11 != 0 && pAVar10->nRegs <= pAVar10->nObjs[2]) {
      lVar16 = 0;
      do {
        if (pAVar10->vCis->nSize <= lVar16) goto LAB_005c45ec;
        pvVar4 = pAVar10->vCis->pArray[lVar16];
        pAVar8 = Aig_ObjCreateCi(p_00);
        *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar4 + 0x24) * 8) = pAVar8;
        lVar16 = lVar16 + 1;
        pAVar10 = p->pAig;
        uVar15 = (long)pAVar10->nObjs[2] - (long)pAVar10->nRegs;
      } while (lVar16 < (long)uVar15);
    }
    pVVar9 = p->pAig->vCis;
    if ((int)uVar15 < pVVar9->nSize) {
      uVar17 = uVar15 & 0xffffffff;
      do {
        if ((int)uVar15 < 0) goto LAB_005c45ec;
        iVar1 = *(int *)((long)pVVar9->pArray[uVar17] + 0x24);
        lVar16 = *(long *)(*(long *)(*(long *)(*(long *)((long)pVVar9->pArray[uVar17] + 0x28) + 0x30
                                              ) + 8) + (long)iVar1 * 8);
        if (lVar16 != 0) {
          iVar2 = *(int *)(lVar16 + 0x24);
          if (iVar1 <= iVar2) goto LAB_005c460b;
          pAVar13 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + (long)iVar1 * 8) & 0xfffffffffffffffe);
          pAVar8 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + (long)iVar2 * 8) & 0xfffffffffffffffe);
          if (pAVar13 != pAVar8) {
            pAVar8 = Aig_Exor(p_00,pAVar13,pAVar8);
            Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                 ((ulong)(((uint)pAVar8 ^
                                          *(uint *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18) >>
                                          3) & 1) ^ (ulong)pAVar8 ^ 1));
          }
        }
        uVar17 = uVar17 + 1;
        pVVar9 = p->pAig->vCis;
      } while ((int)uVar17 < pVVar9->nSize);
    }
    pAVar10 = p->pAig;
    pVVar9 = pAVar10->vObjs;
    if (0 < pVVar9->nSize) {
      lVar16 = 0;
      do {
        pvVar4 = pVVar9->pArray[lVar16];
        if ((pvVar4 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar4 + 0x18) & 7) - 7)) {
          pAVar8 = Aig_And(p_00,(Aig_Obj_t *)
                                ((ulong)((uint)*(ulong *)((long)pvVar4 + 8) & 1) ^
                                *(ulong *)((long)__ptr +
                                          (long)*(int *)((*(ulong *)((long)pvVar4 + 8) &
                                                         0xfffffffffffffffe) + 0x24) * 8)),
                           (Aig_Obj_t *)
                           ((ulong)((uint)*(ulong *)((long)pvVar4 + 0x10) & 1) ^
                           *(ulong *)((long)__ptr +
                                     (long)*(int *)((*(ulong *)((long)pvVar4 + 0x10) &
                                                    0xfffffffffffffffe) + 0x24) * 8)));
          iVar1 = *(int *)((long)pvVar4 + 0x24);
          *(Aig_Obj_t **)((long)__ptr + (long)iVar1 * 8) = pAVar8;
          lVar5 = *(long *)(*(long *)(*(long *)(*(long *)((long)pvVar4 + 0x28) + 0x30) + 8) +
                           (long)iVar1 * 8);
          if (lVar5 != 0) {
            iVar2 = *(int *)(lVar5 + 0x24);
            if (iVar1 <= iVar2) {
LAB_005c460b:
              __assert_fail("pObjRepr->Id < pObj->Id",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                            ,0x2fe,
                            "void Fra_ClassesDeriveNode(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t **)");
            }
            pAVar13 = (Aig_Obj_t *)(*(ulong *)((long)__ptr + (long)iVar2 * 8) & 0xfffffffffffffffe);
            if ((Aig_Obj_t *)((ulong)pAVar8 & 0xfffffffffffffffe) != pAVar13) {
              pAVar8 = Aig_Exor(p_00,(Aig_Obj_t *)((ulong)pAVar8 & 0xfffffffffffffffe),pAVar13);
              Aig_ObjCreateCo(p_00,(Aig_Obj_t *)
                                   ((ulong)(((uint)pAVar8 ^
                                            *(uint *)(((ulong)pAVar8 & 0xfffffffffffffffe) + 0x18)
                                            >> 3) & 1) ^ (ulong)pAVar8 ^ 1));
            }
          }
        }
        lVar16 = lVar16 + 1;
        pAVar10 = p->pAig;
        pVVar9 = pAVar10->vObjs;
      } while (lVar16 < pVVar9->nSize);
    }
    if (iVar12 == nFramesK) break;
    if (iVar12 == nFramesK + -1) {
      p_00->nAsserts = p_00->nObjs[3];
    }
    iVar1 = pAVar10->nRegs;
    uVar11 = pAVar10->nObjs[3] - iVar1;
    pVVar9 = pAVar10->vCos;
    if ((int)uVar11 < pVVar9->nSize) {
      uVar15 = (ulong)uVar11;
      puVar14 = __ptr_00;
      do {
        if ((int)uVar11 < 0) goto LAB_005c45ec;
        uVar17 = *(ulong *)((long)pVVar9->pArray[uVar15] + 8);
        *puVar14 = (ulong)((uint)uVar17 & 1) ^
                   *(ulong *)((long)__ptr + (long)*(int *)((uVar17 & 0xfffffffffffffffe) + 0x24) * 8
                             );
        uVar15 = uVar15 + 1;
        pVVar9 = pAVar10->vCos;
        puVar14 = puVar14 + 1;
      } while ((int)uVar15 < pVVar9->nSize);
    }
    uVar11 = pAVar10->nObjs[2] - iVar1;
    pVVar9 = pAVar10->vCis;
    if ((int)uVar11 < pVVar9->nSize) {
      uVar15 = (ulong)uVar11;
      puVar14 = __ptr_00;
      do {
        if ((int)uVar11 < 0) goto LAB_005c45ec;
        *(ulong *)((long)__ptr + (long)*(int *)((long)pVVar9->pArray[uVar15] + 0x24) * 8) = *puVar14
        ;
        uVar15 = uVar15 + 1;
        pVVar9 = pAVar10->vCis;
        puVar14 = puVar14 + 1;
      } while ((int)uVar15 < pVVar9->nSize);
    }
    bVar18 = iVar12 != nFramesK;
    iVar12 = iVar12 + 1;
  } while (bVar18);
  if (__ptr_00 != (ulong *)0x0) {
    free(__ptr_00);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (p_00->nObjs[3] % (nFramesK + 1) == 0) {
    printf("Assert miters = %6d. Output miters = %6d.\n",(ulong)(uint)p_00->nAsserts,
           (ulong)(uint)(p_00->nObjs[3] - p_00->nAsserts));
    Aig_ManCleanup(p_00);
    return p_00;
  }
  __assert_fail("Aig_ManCoNum(pManFraig) % nFramesAll == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraClass.c"
                ,0x350,"Aig_Man_t *Fra_ClassesDeriveAig(Fra_Cla_t *, int)");
}

Assistant:

Aig_Man_t * Fra_ClassesDeriveAig( Fra_Cla_t * p, int nFramesK )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches, ** ppEquivs;
    int i, k, f, nFramesAll = nFramesK + 1;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    assert( nFramesK > 0 );
    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * nFramesAll );
    pManFraig->pName = Abc_UtilStrsav( p->pAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // allocate place for the node mapping
    ppEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p->pAig) );
    Fra_ObjSetEqu( ppEquivs, Aig_ManConst1(p->pAig), Aig_ManConst1(pManFraig) );
    // create latches for the first frame
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < nFramesAll; f++ )
    {
        // create PIs for this frame
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, Aig_ObjCreateCi(pManFraig) );
        // set the constraints on the latch outputs
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pManFraig, Fra_ObjChild0Equ(ppEquivs, pObj), Fra_ObjChild1Equ(ppEquivs, pObj) );
            Fra_ObjSetEqu( ppEquivs, pObj, pObjNew );
            Fra_ClassesDeriveNode( pManFraig, pObj, ppEquivs );
        }
        if ( f == nFramesAll - 1 )
            break;
        if ( f == nFramesAll - 2 )
            pManFraig->nAsserts = Aig_ManCoNum(pManFraig);
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Fra_ObjChild0Equ( ppEquivs, pObj );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Fra_ObjSetEqu( ppEquivs, pObj, pLatches[k++] );
    }
    ABC_FREE( pLatches );
    ABC_FREE( ppEquivs );
    // mark the asserts
    assert( Aig_ManCoNum(pManFraig) % nFramesAll == 0 );
printf( "Assert miters = %6d. Output miters = %6d.\n", 
       pManFraig->nAsserts, Aig_ManCoNum(pManFraig) - pManFraig->nAsserts );
    // remove dangling nodes
    Aig_ManCleanup( pManFraig );
    return pManFraig;
}